

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::zoomInF(QPlainTextEdit *this,float range)

{
  QFont *pQVar1;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  double dVar2;
  float newSize;
  QFont f;
  undefined1 *local_18;
  QFont *font;
  QWidget *this_00;
  
  this_00 = *(QWidget **)(in_FS_OFFSET + 0x28);
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    font = (QFont *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = QWidget::font(in_RDI);
    QFont::QFont((QFont *)&local_18,pQVar1);
    dVar2 = (double)QFont::pointSizeF();
    if (0.0 < (float)(dVar2 + (double)in_XMM0_Da)) {
      QFont::setPointSizeF((double)(float)(dVar2 + (double)in_XMM0_Da));
      QWidget::setFont(this_00,font);
    }
    QFont::~QFont((QFont *)&local_18);
  }
  if (*(QWidget **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEdit::zoomInF(float range)
{
    if (range == 0.f)
        return;
    QFont f = font();
    const float newSize = f.pointSizeF() + range;
    if (newSize <= 0)
        return;
    f.setPointSizeF(newSize);
    setFont(f);
}